

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Sigmoid_x86_fma::forward_inplace(Sigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  ulong uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar24 [32];
  undefined1 auVar18 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar30 [16];
  undefined1 extraout_var [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 local_108 [16];
  float local_b8;
  undefined1 auVar23 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar35 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar51 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    lVar8 = 0;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    do {
      auVar56._8_4_ = 0x395e8083;
      auVar56._0_8_ = 0x395e8083395e8083;
      auVar53._8_4_ = 0x3f318000;
      auVar53._0_8_ = 0x3f3180003f318000;
      auVar49._8_4_ = 0x3d2aa9c1;
      auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._8_4_ = 0x3f000000;
      auVar47._0_8_ = 0x3f0000003f000000;
      auVar12._8_4_ = 0x3c088908;
      auVar12._0_8_ = 0x3c0889083c088908;
      auVar42._8_4_ = 0x39506967;
      auVar42._0_8_ = 0x3950696739506967;
      auVar40._8_4_ = 0x3fb8aa3b;
      auVar40._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar39._8_4_ = 0xc2b0c0a5;
      auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._8_4_ = 0x42b0c0a5;
      auVar31._0_8_ = 0x42b0c0a542b0c0a5;
      auVar56._12_4_ = 0x395e8083;
      auVar53._12_4_ = 0x3f318000;
      auVar49._12_4_ = 0x3d2aa9c1;
      auVar47._12_4_ = 0x3f000000;
      auVar12._12_4_ = 0x3c088908;
      auVar42._12_4_ = 0x39506967;
      auVar40._12_4_ = 0x3fb8aa3b;
      auVar39._12_4_ = 0xc2b0c0a5;
      auVar31._12_4_ = 0x42b0c0a5;
      auVar56._16_4_ = 0x395e8083;
      auVar53._16_4_ = 0x3f318000;
      auVar49._16_4_ = 0x3d2aa9c1;
      auVar47._16_4_ = 0x3f000000;
      auVar45._16_4_ = 0x3c088908;
      auVar45._0_16_ = auVar12;
      auVar42._16_4_ = 0x39506967;
      auVar40._16_4_ = 0x3fb8aa3b;
      auVar39._16_4_ = 0xc2b0c0a5;
      auVar35._16_4_ = 0x42b0c0a5;
      auVar35._0_16_ = auVar31;
      auVar56._20_4_ = 0x395e8083;
      auVar53._20_4_ = 0x3f318000;
      auVar49._20_4_ = 0x3d2aa9c1;
      auVar47._20_4_ = 0x3f000000;
      auVar45._20_4_ = 0x3c088908;
      auVar42._20_4_ = 0x39506967;
      auVar40._20_4_ = 0x3fb8aa3b;
      auVar39._20_4_ = 0xc2b0c0a5;
      auVar35._20_4_ = 0x42b0c0a5;
      auVar56._24_4_ = 0x395e8083;
      auVar53._24_4_ = 0x3f318000;
      auVar49._24_4_ = 0x3d2aa9c1;
      auVar47._24_4_ = 0x3f000000;
      auVar45._24_4_ = 0x3c088908;
      auVar42._24_4_ = 0x39506967;
      auVar40._24_4_ = 0x3fb8aa3b;
      auVar39._24_4_ = 0xc2b0c0a5;
      auVar35._24_4_ = 0x42b0c0a5;
      auVar56._28_4_ = 0x395e8083;
      auVar53._28_4_ = 0x3f318000;
      auVar49._28_4_ = 0x3d2aa9c1;
      auVar47._28_4_ = 0x3f000000;
      auVar45._28_4_ = 0x3c088908;
      auVar42._28_4_ = 0x39506967;
      auVar40._28_4_ = 0x3fb8aa3b;
      auVar39._28_4_ = 0xc2b0c0a5;
      auVar35._28_4_ = 0x42b0c0a5;
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar4 = 0;
        auVar31 = auVar12;
      }
      else {
        iVar3 = 7;
        do {
          auVar18._0_8_ = *(ulong *)*pauVar9 ^ 0x8000000080000000;
          auVar18._8_4_ = *(uint *)((long)*pauVar9 + 8) ^ 0x80000000;
          auVar18._12_4_ = *(uint *)((long)*pauVar9 + 0xc) ^ 0x80000000;
          auVar18._16_4_ = *(uint *)((long)*pauVar9 + 0x10) ^ 0x80000000;
          auVar18._20_4_ = *(uint *)((long)*pauVar9 + 0x14) ^ 0x80000000;
          auVar18._24_4_ = *(uint *)((long)*pauVar9 + 0x18) ^ 0x80000000;
          auVar18._28_4_ = *(uint *)((long)*pauVar9 + 0x1c) ^ 0x80000000;
          auVar18 = vminps_avx(auVar18,auVar35);
          auVar2 = vmaxps_avx(auVar18,auVar39);
          auVar12 = vfmadd213ps_fma(auVar40,auVar2,auVar47);
          auVar20 = vroundps_avx(ZEXT1632(auVar12),1);
          auVar18 = vcmpps_avx(ZEXT1632(auVar12),auVar20,1);
          auVar21 = auVar51._0_32_;
          auVar18 = vandps_avx(auVar21,auVar18);
          auVar18 = vsubps_avx(auVar20,auVar18);
          auVar12 = vfmsub231ps_fma(auVar2,auVar18,auVar53);
          auVar32 = vfmsub231ps_fma(ZEXT1632(auVar12),auVar18,auVar56);
          auVar19 = ZEXT1632(auVar32);
          auVar2._28_4_ = auVar20._28_4_;
          auVar2._0_28_ =
               ZEXT1628(CONCAT412(auVar32._12_4_ * auVar32._12_4_,
                                  CONCAT48(auVar32._8_4_ * auVar32._8_4_,
                                           CONCAT44(auVar32._4_4_ * auVar32._4_4_,
                                                    auVar32._0_4_ * auVar32._0_4_))));
          auVar58._8_4_ = 0x3ab743ce;
          auVar58._0_8_ = 0x3ab743ce3ab743ce;
          auVar58._12_4_ = 0x3ab743ce;
          auVar58._16_4_ = 0x3ab743ce;
          auVar58._20_4_ = 0x3ab743ce;
          auVar58._24_4_ = 0x3ab743ce;
          auVar58._28_4_ = 0x3ab743ce;
          auVar12 = vfmadd213ps_fma(auVar42,auVar19,auVar58);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar19,auVar45);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar19,auVar49);
          auVar59._8_4_ = 0x3e2aaaaa;
          auVar59._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar59._12_4_ = 0x3e2aaaaa;
          auVar59._16_4_ = 0x3e2aaaaa;
          auVar59._20_4_ = 0x3e2aaaaa;
          auVar59._24_4_ = 0x3e2aaaaa;
          auVar59._28_4_ = 0x3e2aaaaa;
          auVar20 = ZEXT1632(auVar32);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar20,auVar59);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar20,auVar47);
          auVar41 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar2,auVar20);
          auVar32._0_4_ = (int)auVar18._0_4_;
          auVar32._4_4_ = (int)auVar18._4_4_;
          auVar32._8_4_ = (int)auVar18._8_4_;
          auVar32._12_4_ = (int)auVar18._12_4_;
          auVar20._16_4_ = (int)auVar18._16_4_;
          auVar20._0_16_ = auVar32;
          auVar20._20_4_ = (int)auVar18._20_4_;
          auVar20._24_4_ = (int)auVar18._24_4_;
          auVar20._28_4_ = (int)auVar18._28_4_;
          auVar32 = vpslld_avx(auVar32,0x17);
          auVar12 = vpslld_avx(auVar20._16_16_,0x17);
          auVar48._8_4_ = 0x3f800000;
          auVar48._0_8_ = 0x3f8000003f800000;
          auVar48._12_4_ = 0x3f800000;
          auVar12 = vpaddd_avx(auVar48,auVar12);
          auVar32 = vpaddd_avx(auVar48,auVar32);
          auVar19._16_16_ = auVar12;
          auVar19._0_16_ = auVar32;
          auVar36._0_4_ = auVar51._0_4_ + auVar41._0_4_;
          auVar36._4_4_ = auVar51._4_4_ + auVar41._4_4_;
          auVar36._8_4_ = auVar51._8_4_ + auVar41._8_4_;
          auVar36._12_4_ = auVar51._12_4_ + auVar41._12_4_;
          auVar36._16_4_ = auVar51._16_4_ + 0.0;
          auVar36._20_4_ = auVar51._20_4_ + 0.0;
          auVar36._24_4_ = auVar51._24_4_ + 0.0;
          auVar36._28_4_ = auVar51._28_4_ + 0.0;
          auVar12 = vfmadd213ps_fma(auVar19,auVar36,auVar21);
          auVar18 = vrcpps_avx(ZEXT1632(auVar12));
          auVar12 = vfmsub213ps_fma(ZEXT1632(auVar12),auVar18,auVar21);
          auVar12 = vfnmadd132ps_fma(ZEXT1632(auVar12),auVar18,auVar18);
          *pauVar9 = ZEXT1632(auVar12);
          pauVar9 = pauVar9 + 1;
          iVar3 = iVar3 + 8;
          uVar4 = uVar7 & 0xfffffff8;
        } while (iVar3 < (int)uVar7);
      }
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar46._8_4_ = 0x42b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar46._12_4_ = 0x42b0c0a5;
      auVar30._8_4_ = 0xc2b0c0a5;
      auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar30._12_4_ = 0xc2b0c0a5;
      auVar52._8_4_ = 0x3fb8aa3b;
      auVar52._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar52._12_4_ = 0x3fb8aa3b;
      auVar54._8_4_ = 0x3f000000;
      auVar54._0_8_ = 0x3f0000003f000000;
      auVar54._12_4_ = 0x3f000000;
      auVar55._8_4_ = 0x3f318000;
      auVar55._0_8_ = 0x3f3180003f318000;
      auVar55._12_4_ = 0x3f318000;
      auVar57._8_4_ = 0x395e8083;
      auVar57._0_8_ = 0x395e8083395e8083;
      auVar57._12_4_ = 0x395e8083;
      auVar60._8_4_ = 0x3ab743ce;
      auVar60._0_8_ = 0x3ab743ce3ab743ce;
      auVar60._12_4_ = 0x3ab743ce;
      auVar61._8_4_ = 0x39506967;
      auVar61._0_8_ = 0x3950696739506967;
      auVar61._12_4_ = 0x39506967;
      uVar6 = uVar4 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar31 = *(undefined1 (*) [16])*pauVar9;
        auVar13._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar13._8_4_ = auVar31._8_4_ ^ 0x80000000;
        auVar13._12_4_ = auVar31._12_4_ ^ 0x80000000;
        auVar31 = vminps_avx(auVar13,auVar46);
        auVar32 = vmaxps_avx(auVar30,auVar31);
        auVar31 = vfmadd213ps_fma(auVar52,auVar32,auVar54);
        auVar37._0_4_ = (int)auVar31._0_4_;
        auVar37._4_4_ = (int)auVar31._4_4_;
        auVar37._8_4_ = (int)auVar31._8_4_;
        auVar37._12_4_ = (int)auVar31._12_4_;
        auVar12 = vcvtdq2ps_avx(auVar37);
        auVar31 = vcmpps_avx(auVar31,auVar12,1);
        auVar31 = vandps_avx(auVar31,auVar41);
        auVar12 = vsubps_avx(auVar12,auVar31);
        auVar31 = vfmsub231ps_fma(auVar32,auVar12,auVar55);
        auVar48 = vfmsub231ps_fma(auVar31,auVar12,auVar57);
        auVar38._0_4_ = auVar48._0_4_ * auVar48._0_4_;
        auVar38._4_4_ = auVar48._4_4_ * auVar48._4_4_;
        auVar38._8_4_ = auVar48._8_4_ * auVar48._8_4_;
        auVar38._12_4_ = auVar48._12_4_ * auVar48._12_4_;
        auVar31 = vfmadd213ps_fma(auVar61,auVar48,auVar60);
        auVar43._8_4_ = 0x3c088908;
        auVar43._0_8_ = 0x3c0889083c088908;
        auVar43._12_4_ = 0x3c088908;
        auVar31 = vfmadd213ps_fma(auVar31,auVar48,auVar43);
        auVar44._8_4_ = 0x3d2aa9c1;
        auVar44._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar44._12_4_ = 0x3d2aa9c1;
        auVar32 = vfmadd213ps_fma(auVar31,auVar48,auVar44);
        auVar31._8_4_ = 0x3e2aaaaa;
        auVar31._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar31._12_4_ = 0x3e2aaaaa;
        auVar32 = vfmadd213ps_fma(auVar32,auVar48,auVar31);
        auVar32 = vfmadd213ps_fma(auVar32,auVar48,auVar54);
        auVar32 = vfmadd213ps_fma(auVar32,auVar38,auVar48);
        auVar14._0_4_ = auVar32._0_4_ + 1.0;
        auVar14._4_4_ = auVar32._4_4_ + 1.0;
        auVar14._8_4_ = auVar32._8_4_ + 1.0;
        auVar14._12_4_ = auVar32._12_4_ + 1.0;
        auVar33._0_4_ = (int)auVar12._0_4_;
        auVar33._4_4_ = (int)auVar12._4_4_;
        auVar33._8_4_ = (int)auVar12._8_4_;
        auVar33._12_4_ = (int)auVar12._12_4_;
        auVar12 = vpslld_avx(auVar33,0x17);
        auVar12 = vpaddd_avx(auVar12,auVar41);
        auVar32 = vfmadd213ps_fma(auVar12,auVar14,auVar41);
        auVar12 = vrcpps_avx(auVar32);
        auVar32 = vfmsub213ps_fma(auVar32,auVar12,auVar41);
        auVar12 = vfnmadd132ps_fma(auVar32,auVar12,auVar12);
        *(undefined1 (*) [16])*pauVar9 = auVar12;
        pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 0x10);
        uVar6 = uVar4 + 7;
        uVar4 = uVar4 + 4;
      }
      auVar31 = vpcmpeqd_avx(auVar31,auVar31);
      if ((int)uVar4 < (int)uVar7) {
        uVar5 = CONCAT44(0,~uVar4 + uVar7);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar5;
        auVar41 = vpshufd_avx(auVar15,0x44);
        auVar12 = vorps_avx(auVar41,auVar11);
        auVar32 = vorps_avx(auVar41,auVar11);
        uVar10 = 0;
        auVar35 = _DAT_00515ce0;
        do {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar10;
          auVar48 = vpshufd_avx(auVar16,0x44);
          auVar21._16_16_ = auVar48;
          auVar21._0_16_ = auVar48;
          auVar39 = vorps_avx(auVar21,_DAT_00515cc0);
          auVar35 = vorps_avx(auVar21,auVar35);
          auVar30 = vpor_avx(auVar41,auVar11);
          auVar48 = vpcmpgtq_avx(auVar35._16_16_ ^ auVar11,auVar30);
          auVar46 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar11,auVar12);
          auVar48 = vpackssdw_avx(auVar46,auVar48);
          auVar46 = vpcmpgtq_avx(auVar39._16_16_ ^ auVar11,auVar30);
          auVar34._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
          auVar34._8_4_ = auVar39._8_4_;
          auVar34._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar30 = vpcmpgtq_avx(auVar34,auVar32);
          auVar46 = vpackssdw_avx(auVar30,auVar46);
          auVar48 = vpackssdw_avx(auVar46 ^ auVar31,auVar48 ^ auVar31);
          auVar46 = vpmovsxwd_avx(auVar48);
          auVar48 = vpunpckhwd_avx(auVar48,auVar48);
          auVar22._16_16_ = auVar48;
          auVar22._0_16_ = auVar46;
          auVar35 = vmaskmovps_avx(auVar22,*(undefined1 (*) [32])((long)*pauVar9 + uVar10 * 4));
          auVar17._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
          auVar17._8_4_ = auVar35._8_4_ ^ 0x80000000;
          auVar17._12_4_ = auVar35._12_4_ ^ 0x80000000;
          auVar23._16_4_ = -auVar35._16_4_;
          auVar23._0_16_ = auVar17;
          auVar23._20_4_ = auVar35._20_4_ ^ 0x80000000;
          auVar23._24_4_ = auVar35._24_4_ ^ 0x80000000;
          auVar23._28_4_ = auVar35._28_4_ ^ 0x80000000;
          auVar30 = auVar23._16_16_;
          local_108._0_4_ = expf(auVar23._16_4_);
          local_108._4_4_ = extraout_XMM0_Db;
          local_108._8_4_ = extraout_XMM0_Dc;
          local_108._12_4_ = extraout_XMM0_Dd;
          auVar48 = vpermilps_avx(auVar30,0xf5);
          auVar51._0_4_ = expf(auVar48._0_4_);
          auVar51._4_60_ = extraout_var;
          auVar48 = vinsertps_avx(local_108,auVar51._0_16_,0x10);
          auVar46 = vpermilps_avx(auVar30,0x4e);
          auVar25._0_4_ = expf(auVar46._0_4_);
          auVar25._4_60_ = extraout_var_00;
          auVar48 = vinsertps_avx(auVar48,auVar25._0_16_,0x20);
          auVar46 = vpermilps_avx(auVar30,0xff);
          auVar26._0_4_ = expf(auVar46._0_4_);
          auVar26._4_60_ = extraout_var_01;
          auVar48 = vinsertps_avx(auVar48,auVar26._0_16_,0x30);
          local_b8 = (float)auVar17._0_8_;
          local_108._0_4_ = expf(local_b8);
          local_108._4_4_ = extraout_XMM0_Db_00;
          local_108._8_4_ = extraout_XMM0_Dc_00;
          local_108._12_4_ = extraout_XMM0_Dd_00;
          auVar46 = vpermilps_avx(auVar17,0xf5);
          auVar27._0_4_ = expf(auVar46._0_4_);
          auVar27._4_60_ = extraout_var_02;
          auVar46 = vinsertps_avx(local_108,auVar27._0_16_,0x10);
          auVar30 = vpermilps_avx(auVar17,0x4e);
          auVar28._0_4_ = expf(auVar30._0_4_);
          auVar28._4_60_ = extraout_var_03;
          auVar46 = vinsertps_avx(auVar46,auVar28._0_16_,0x20);
          auVar30 = vpermilps_avx(auVar17,0xff);
          auVar29._0_4_ = expf(auVar30._0_4_);
          auVar35 = _DAT_00515ce0;
          auVar29._4_60_ = extraout_var_04;
          auVar31 = vpcmpeqd_avx(auVar31,auVar31);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar50._16_4_ = 0x3f800000;
          auVar50._20_4_ = 0x3f800000;
          auVar50._24_4_ = 0x3f800000;
          auVar50._28_4_ = 0x3f800000;
          auVar51 = ZEXT3264(auVar50);
          auVar46 = vinsertps_avx(auVar46,auVar29._0_16_,0x30);
          auVar24._0_4_ = auVar46._0_4_ + 1.0;
          auVar24._4_4_ = auVar46._4_4_ + 1.0;
          auVar24._8_4_ = auVar46._8_4_ + 1.0;
          auVar24._12_4_ = auVar46._12_4_ + 1.0;
          auVar24._16_4_ = auVar48._0_4_ + 1.0;
          auVar24._20_4_ = auVar48._4_4_ + 1.0;
          auVar24._24_4_ = auVar48._8_4_ + 1.0;
          auVar24._28_4_ = auVar48._12_4_ + 1.0;
          auVar39 = vrcpps_avx(auVar24);
          auVar48 = vfmsub213ps_fma(auVar24,auVar39,auVar50);
          auVar48 = vfnmadd132ps_fma(ZEXT1632(auVar48),auVar39,auVar39);
          auVar39 = vmaskmovps_avx(auVar22,ZEXT1632(auVar48));
          *(undefined1 (*) [32])((long)*pauVar9 + uVar10 * 4) = auVar39;
          uVar10 = uVar10 + 8;
        } while ((uVar5 + 8 & 0xfffffffffffffff8) != uVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}